

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O0

int tnt_request_writeout(tnt_stream *s,tnt_request *req,uint64_t *sync)

{
  tnt_request_t tVar1;
  uint64_t uVar2;
  uint32_t uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  ssize_t sVar8;
  int iVar9;
  ssize_t rv;
  size_t hlen;
  uint64_t uStack_190;
  int i;
  size_t plen;
  size_t nd;
  char *map;
  char *begin;
  char *pos;
  char header [128];
  int local_dc;
  undefined1 auStack_d8 [4];
  int v_sz;
  iovec v [10];
  tnt_request_t tp;
  uint64_t *sync_local;
  tnt_request *req_local;
  tnt_stream *s_local;
  
  tVar1 = (req->hdr).type;
  if (((sync != (uint64_t *)0x0) && (*sync == 0x7fffffffffffffff)) &&
     ((s->reqid & 0x7fffffffffffffff) == 0x7fffffffffffffff)) {
    s->reqid = 0;
  }
  uVar2 = s->reqid;
  s->reqid = uVar2 + 1;
  (req->hdr).sync = uVar2;
  pcVar6 = header + 1;
  local_dc = 1;
  v[0].iov_base = (void *)0x0;
  _auStack_d8 = pcVar6;
  pcVar4 = mp_encode_map(pcVar6,2);
  pcVar4 = mp_encode_uint(pcVar4,0);
  pcVar4 = mp_encode_uint(pcVar4,(ulong)(req->hdr).type);
  pcVar4 = mp_encode_uint(pcVar4,1);
  pcVar4 = mp_encode_uint(pcVar4,(req->hdr).sync);
  begin = pcVar4 + 1;
  plen._0_4_ = 0;
  if ((tVar1 < TNT_OP_CALL_16) || (tVar1 == TNT_OP_UPSERT)) {
    pcVar5 = mp_encode_uint(begin,0x10);
    begin = mp_encode_uint(pcVar5,(ulong)req->space_id);
    plen._0_4_ = 1;
  }
  if ((req->index_id != 0) &&
     (((tVar1 == TNT_OP_SELECT || (tVar1 == TNT_OP_UPDATE)) || (tVar1 == TNT_OP_DELETE)))) {
    pcVar5 = mp_encode_uint(begin,0x11);
    begin = mp_encode_uint(pcVar5,(ulong)req->index_id);
    plen._0_4_ = (uint32_t)plen + 1;
  }
  if (tVar1 == TNT_OP_SELECT) {
    pcVar5 = mp_encode_uint(begin,0x12);
    begin = mp_encode_uint(pcVar5,(ulong)req->limit);
    plen._0_4_ = (uint32_t)plen + 1;
  }
  if ((req->offset != 0) && (tVar1 == TNT_OP_SELECT)) {
    pcVar5 = mp_encode_uint(begin,0x13);
    begin = mp_encode_uint(pcVar5,(ulong)req->offset);
    plen._0_4_ = (uint32_t)plen + 1;
  }
  if ((req->iterator != TNT_ITER_EQ) && (tVar1 == TNT_OP_SELECT)) {
    pcVar5 = mp_encode_uint(begin,0x14);
    begin = mp_encode_uint(pcVar5,(ulong)req->iterator);
    plen._0_4_ = (uint32_t)plen + 1;
  }
  map = pcVar6;
  if (req->key != (char *)0x0) {
    switch(tVar1) {
    case TNT_OP_SELECT:
    case TNT_OP_UPDATE:
    case TNT_OP_DELETE:
      begin = mp_encode_uint(begin,0x20);
      break;
    default:
      return -1;
    case TNT_OP_CALL_16:
    case TNT_OP_CALL:
      pcVar5 = mp_encode_uint(begin,0x22);
      begin = mp_encode_strl(pcVar5,(int)req->key_end - (int)req->key);
      break;
    case TNT_OP_EVAL:
      pcVar5 = mp_encode_uint(begin,0x27);
      begin = mp_encode_strl(pcVar5,(int)req->key_end - (int)req->key);
      break;
    case TNT_OP_UPSERT:
      begin = mp_encode_uint(begin,0x28);
    }
    v[1].iov_base = begin + -(long)pcVar6;
    map = begin;
    v[1].iov_len = (size_t)req->key;
    v[2].iov_base = req->key_end + -(long)req->key;
    local_dc = 3;
    plen._0_4_ = (uint32_t)plen + 1;
    v[0].iov_len = (size_t)pcVar6;
  }
  if (req->tuple != (char *)0x0) {
    begin = mp_encode_uint(begin,0x21);
    v[(long)local_dc + -1].iov_len = (size_t)map;
    iVar9 = local_dc + 1;
    v[local_dc].iov_base = begin + -(long)map;
    v[(long)iVar9 + -1].iov_len = (size_t)req->tuple;
    local_dc = local_dc + 2;
    v[iVar9].iov_base = req->tuple_end + -(long)req->tuple;
    plen._0_4_ = (uint32_t)plen + 1;
    map = begin;
  }
  if ((req->index_base != 0) && ((tVar1 == TNT_OP_UPDATE || (tVar1 == TNT_OP_UPSERT)))) {
    pcVar6 = mp_encode_uint(begin,0x15);
    begin = mp_encode_uint(pcVar6,(long)req->index_base);
    plen._0_4_ = (uint32_t)plen + 1;
  }
  uVar3 = mp_sizeof_map((uint32_t)plen);
  if (uVar3 == 1) {
    if (begin != map) {
      v[(long)local_dc + -1].iov_len = (size_t)map;
      v[local_dc].iov_base = begin + -(long)map;
      local_dc = local_dc + 1;
    }
    mp_encode_map(pcVar4,(uint32_t)plen);
    uStack_190 = 0;
    for (hlen._4_4_ = 1; hlen._4_4_ < local_dc; hlen._4_4_ = hlen._4_4_ + 1) {
      uStack_190 = (long)v[hlen._4_4_].iov_base + uStack_190;
    }
    sVar7 = mp_sizeof_luint32(uStack_190);
    _auStack_d8 = _auStack_d8 + -sVar7;
    v[0].iov_base = (void *)(sVar7 + (long)v[0].iov_base);
    mp_encode_luint32(_auStack_d8,uStack_190);
    sVar8 = (*s->writev)(s,(iovec *)auStack_d8,local_dc);
    if (sVar8 == -1) {
      s_local._4_4_ = -1;
    }
    else {
      if (sync != (uint64_t *)0x0) {
        *sync = (req->hdr).sync;
      }
      s_local._4_4_ = 0;
    }
    return s_local._4_4_;
  }
  __assert_fail("mp_sizeof_map(nd) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/tnt/tnt_request.c"
                ,0x135,
                "int tnt_request_writeout(struct tnt_stream *, struct tnt_request *, uint64_t *)");
}

Assistant:

int
tnt_request_writeout(struct tnt_stream *s, struct tnt_request *req,
		     uint64_t *sync) {
	enum tnt_request_t tp = req->hdr.type;
	if (sync != NULL && *sync == INT64_MAX &&
	    (s->reqid & INT64_MAX) == INT64_MAX) {
		s->reqid = 0;
	}
	req->hdr.sync = s->reqid++;
	/* header */
	/* int (9) + 1 + sync + 1 + op */
	struct iovec v[10]; int v_sz = 0;
	char header[128];
	char *pos = header + 9;
	char *begin = pos;
	v[v_sz].iov_base = begin;
	v[v_sz++].iov_len  = 0;
	pos = mp_encode_map(pos, 2);              /* 1 */
	pos = mp_encode_uint(pos, TNT_CODE);      /* 1 */
	pos = mp_encode_uint(pos, req->hdr.type); /* 1 */
	pos = mp_encode_uint(pos, TNT_SYNC);      /* 1 */
	pos = mp_encode_uint(pos, req->hdr.sync); /* 9 */
	char *map = pos++;                        /* 1 */
	size_t nd = 0;
	if (tp < TNT_OP_CALL_16 || tp == TNT_OP_UPSERT) {
		pos = mp_encode_uint(pos, TNT_SPACE);     /* 1 */
		pos = mp_encode_uint(pos, req->space_id); /* 5 */
		nd += 1;
	}
	if (req->index_id && (tp == TNT_OP_SELECT ||
			      tp == TNT_OP_UPDATE ||
			      tp == TNT_OP_DELETE)) {
		pos = mp_encode_uint(pos, TNT_INDEX);     /* 1 */
		pos = mp_encode_uint(pos, req->index_id); /* 5 */
		nd += 1;
	}
	if (tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_LIMIT);  /* 1 */
		pos = mp_encode_uint(pos, req->limit); /* 5 */
		nd += 1;
	}
	if (req->offset && tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_OFFSET);  /* 1 */
		pos = mp_encode_uint(pos, req->offset); /* 5 */
		nd += 1;
	}
	if (req->iterator && tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_ITERATOR);  /* 1 */
		pos = mp_encode_uint(pos, req->iterator); /* 1 */
		nd += 1;
	}
	if (req->key) {
		switch (tp) {
		case TNT_OP_EVAL:
			pos = mp_encode_uint(pos, TNT_EXPRESSION);          /* 1 */
			pos = mp_encode_strl(pos, req->key_end - req->key); /* 5 */
			break;
		case TNT_OP_CALL_16:
		case TNT_OP_CALL:
			pos = mp_encode_uint(pos, TNT_FUNCTION);            /* 1 */
			pos = mp_encode_strl(pos, req->key_end - req->key); /* 5 */
			break;
		case TNT_OP_SELECT:
		case TNT_OP_UPDATE:
		case TNT_OP_DELETE:
			pos = mp_encode_uint(pos, TNT_KEY); /* 1 */
			break;
		case TNT_OP_UPSERT:
			pos = mp_encode_uint(pos, TNT_OPS); /* 1 */
			break;
		default:
			return -1;
		}
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
		begin = pos;
		v[v_sz].iov_base  = (void *)req->key;
		v[v_sz++].iov_len = req->key_end - req->key;
		nd += 1;
	}
	if (req->tuple) {
		pos = mp_encode_uint(pos, TNT_TUPLE); /* 1 */
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
		begin = pos;
		v[v_sz].iov_base  = (void *)req->tuple;
		v[v_sz++].iov_len = req->tuple_end - req->tuple;
		nd += 1;
	}
	if (req->index_base && (tp == TNT_OP_UPDATE || tp == TNT_OP_UPSERT)) {
		pos = mp_encode_uint(pos, TNT_INDEX_BASE);  /* 1 */
		pos = mp_encode_uint(pos, req->index_base); /* 1 */
		nd += 1;
	}
	assert(mp_sizeof_map(nd) == 1);
	if (pos != begin) {
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
	}
	mp_encode_map(map, nd);

	size_t plen = 0;
	for (int i = 1; i < v_sz; ++i) plen += v[i].iov_len;
	size_t hlen = mp_sizeof_luint32(plen);
	v[0].iov_base -= hlen;
	v[0].iov_len  += hlen;
	mp_encode_luint32(v[0].iov_base, plen);
	ssize_t rv = s->writev(s, v, v_sz);
	if (rv == -1)
		return -1;
	if (sync != NULL)
		*sync = req->hdr.sync;
	return 0;
}